

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O3

void * gdImageGifPtr(gdImagePtr im,int *size)

{
  gdIOCtx *out;
  void *pvVar1;
  
  out = gdNewDynamicCtx(0x800,(void *)0x0);
  if (out == (gdIOCtx *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    gdImageGifCtx(im,out);
    pvVar1 = gdDPExtractData(out,size);
    (*out->gd_free)(out);
  }
  return pvVar1;
}

Assistant:

BGD_DECLARE(void *) gdImageGifPtr(gdImagePtr im, int *size)
{
	void *rv;
	gdIOCtx *out = gdNewDynamicCtx(2048, NULL);
	if (out == NULL) return NULL;
	gdImageGifCtx(im, out);
	rv = gdDPExtractData(out, size);
	out->gd_free(out);
	return rv;
}